

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::OptionGroup::format
          (OptionGroup *this,OptionOutput *out,size_t maxW,DescriptionLevel dl)

{
  bool bVar1;
  DescriptionLevel DVar2;
  reference pIVar3;
  Option *pOVar4;
  int in_ECX;
  undefined8 in_RDX;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *in_RSI;
  option_iterator end;
  option_iterator it;
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  local_28;
  int local_1c;
  undefined8 local_18;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28._M_current =
       (IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
       std::
       vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
             ::operator*(&local_28);
    detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator->(pIVar3);
    DVar2 = Option::descLevel((Option *)0x129cc1);
    if ((int)DVar2 <= local_1c) {
      in_stack_ffffffffffffffc0 = local_10;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
               ::operator*(&local_28);
      pOVar4 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::operator*(pIVar3);
      (*(code *)in_stack_ffffffffffffffc0->_M_current[4].ptr_)
                (in_stack_ffffffffffffffc0,pOVar4,local_18);
    }
    __gnu_cxx::
    __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void OptionGroup::format(OptionOutput& out, size_t maxW, DescriptionLevel dl) const {
	for (option_iterator it = options_.begin(), end = options_.end(); it != end; ++it) {
		if ((*it)->descLevel() <= dl) {
			out.printOption(**it, maxW);
		}
	}
}